

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__process_frame_header(stbi__jpeg *z,int scan)

{
  int a;
  int b;
  stbi__context *s;
  byte bVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  stbi__uint32 sVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  char *pcVar13;
  stbi_uc *psVar14;
  byte *pbVar15;
  void *pvVar16;
  byte bVar17;
  ulong uVar18;
  byte *pbVar19;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  int iVar24;
  int *piVar25;
  long lVar26;
  int iVar27;
  ulong uVar28;
  long in_FS_OFFSET;
  ushort uVar29;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar30 [32];
  
  s = z->s;
  uVar8 = stbi__get16be(s);
  if (uVar8 < 0xb) {
LAB_003480c3:
    pcVar13 = "bad SOF len";
  }
  else {
    psVar14 = s->img_buffer;
    if (psVar14 < s->img_buffer_end) {
LAB_003480f8:
      s->img_buffer = psVar14 + 1;
      if (*psVar14 == '\b') {
        sVar9 = stbi__get16be(s);
        s->img_y = sVar9;
        if (sVar9 == 0) {
          pcVar13 = "no header height";
          goto LAB_00348737;
        }
        sVar9 = stbi__get16be(s);
        s->img_x = sVar9;
        if (sVar9 == 0) {
          pcVar13 = "0 width";
          goto LAB_00348737;
        }
        if (0x1000000 < s->img_y) {
          pcVar13 = "too large";
          goto LAB_00348737;
        }
        pbVar19 = s->img_buffer;
        if (pbVar19 < s->img_buffer_end) {
LAB_0034818b:
          pbVar15 = pbVar19 + 1;
          s->img_buffer = pbVar15;
          bVar17 = *pbVar19;
          uVar28 = (ulong)bVar17;
          if ((bVar17 < 5) && ((0x1aU >> (bVar17 & 0x1f) & 1) != 0)) {
            auVar33 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar34 = vpbroadcastq_avx512f(ZEXT816(8));
            s->img_n = (uint)bVar17;
            uVar18 = (ulong)(bVar17 + 7 & 0xf8);
            auVar35 = vpbroadcastq_avx512f();
            auVar36 = vpbroadcastq_avx512f();
            do {
              auVar37._8_8_ = 0x60;
              auVar37._0_8_ = 0x60;
              auVar37._16_8_ = 0x60;
              auVar37._24_8_ = 0x60;
              auVar37._32_8_ = 0x60;
              auVar37._40_8_ = 0x60;
              auVar37._48_8_ = 0x60;
              auVar37._56_8_ = 0x60;
              auVar37 = vpmullq_avx512dq(auVar33,auVar37);
              uVar5 = vpcmpuq_avx512f(auVar33,auVar35,2);
              auVar33 = vpaddq_avx512f(auVar33,auVar34);
              uVar18 = uVar18 - 8;
              auVar37 = vpaddq_avx512f(auVar36,auVar37);
              vpscatterqq_avx512f(ZEXT864(0x30) + auVar37,uVar5,ZEXT1664((undefined1  [16])0x0));
              vpscatterqq_avx512f(ZEXT864(0x48) + auVar37,uVar5,ZEXT1664((undefined1  [16])0x0));
            } while (uVar18 != 0);
            if (uVar8 == (uint)bVar17 * 3 + 8) {
              piVar25 = &z->img_comp[0].tq;
              lVar26 = 0;
              z->rgb = 0;
              auVar33 = vmovdqu64_avx512f(auVar36);
              do {
                iVar12 = (int)uVar28;
                if (pbVar15 < s->img_buffer_end) {
LAB_00348284:
                  s->img_buffer = pbVar15 + 1;
                  bVar17 = *pbVar15;
                  pbVar15 = pbVar15 + 1;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    pbVar15 = s->img_buffer;
                    iVar12 = s->img_n;
                    goto LAB_00348284;
                  }
                  bVar17 = 0;
                }
                ((anon_struct_96_18_0d0905d3 *)(piVar25 + -3))->id = (uint)bVar17;
                if ((iVar12 == 3) && (bVar17 == "RGB"[lVar26])) {
                  z->rgb = z->rgb + 1;
                }
                if (s->img_buffer_end <= pbVar15) {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    pbVar15 = s->img_buffer;
                    goto LAB_003482dc;
                  }
                  piVar25[-2] = 0;
LAB_00348730:
                  pcVar13 = "bad H";
                  goto LAB_00348737;
                }
LAB_003482dc:
                pbVar19 = pbVar15 + 1;
                s->img_buffer = pbVar19;
                bVar17 = *pbVar15;
                piVar25[-2] = (uint)(bVar17 >> 4);
                if ((byte)(bVar17 + 0xb0) < 0xc0) goto LAB_00348730;
                piVar25[-1] = bVar17 & 0xf;
                if ((bVar17 & 0xf) - 5 < 0xfffffffc) {
                  pcVar13 = "bad V";
                  goto LAB_00348737;
                }
                if (pbVar19 < s->img_buffer_end) {
LAB_00348332:
                  s->img_buffer = pbVar19 + 1;
                  bVar17 = *pbVar19;
                  *piVar25 = (uint)bVar17;
                  pbVar15 = pbVar19 + 1;
                  if (3 < bVar17) {
                    pcVar13 = "bad TQ";
                    goto LAB_00348737;
                  }
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    pbVar19 = s->img_buffer;
                    goto LAB_00348332;
                  }
                  *piVar25 = 0;
                  pbVar15 = pbVar19;
                }
                iVar12 = s->img_n;
                uVar28 = (ulong)iVar12;
                lVar26 = lVar26 + 1;
                piVar25 = piVar25 + 0x18;
              } while (lVar26 < (long)uVar28);
              if (scan != 0) {
                return 1;
              }
              sVar9 = s->img_x;
              uVar8 = s->img_y;
              uVar18 = (ulong)uVar8;
              iVar10 = stbi__mad3sizes_valid(sVar9,uVar8,iVar12,0);
              if (iVar10 == 0) {
                *(char **)(in_FS_OFFSET + -0x408) = "too large";
                return 0;
              }
              uVar22 = 1;
              uVar21 = 1;
              if (0 < iVar12) {
                auVar34 = vpbroadcastd_avx512f(ZEXT416(1));
                auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                auVar37 = vpbroadcastq_avx512f(ZEXT816(0x10));
                auVar38 = vpbroadcastq_avx512f(ZEXT816(0x60));
                auVar33 = vmovdqu64_avx512f(auVar33);
                uVar21 = (ulong)(iVar12 + 0xfU & 0xfffffff0);
                auVar39 = vpbroadcastq_avx512f();
                auVar40 = vmovdqa64_avx512f(auVar34);
                do {
                  auVar41 = vmovdqa64_avx512f(auVar40);
                  auVar40 = vpmullq_avx512dq(auVar35,auVar38);
                  auVar42 = vmovdqa64_avx512f(auVar34);
                  auVar34 = vpmullq_avx512dq(auVar36,auVar38);
                  uVar22 = vpcmpuq_avx512f(auVar35,auVar39,2);
                  uVar6 = vpcmpuq_avx512f(auVar36,auVar39,2);
                  auVar36 = vpaddq_avx512f(auVar36,auVar37);
                  auVar35 = vpaddq_avx512f(auVar35,auVar37);
                  uVar21 = uVar21 - 0x10;
                  vpaddq_avx512f(auVar33,auVar40);
                  vpaddq_avx512f(auVar33,auVar34);
                  auVar30 = vpgatherqd_avx512f(CONCAT44(_DAT_00000009,_DAT_00000005));
                  bVar17 = (byte)uVar22;
                  auVar31._4_4_ = (uint)((byte)(uVar22 >> 1) & 1) * auVar30._4_4_;
                  auVar31._0_4_ = (uint)(bVar17 & 1) * auVar30._0_4_;
                  auVar31._8_4_ = (uint)((byte)(uVar22 >> 2) & 1) * auVar30._8_4_;
                  auVar31._12_4_ = (uint)((byte)(uVar22 >> 3) & 1) * auVar30._12_4_;
                  auVar31._16_4_ = (uint)((byte)(uVar22 >> 4) & 1) * auVar30._16_4_;
                  auVar31._20_4_ = (uint)((byte)(uVar22 >> 5) & 1) * auVar30._20_4_;
                  auVar31._24_4_ = (uint)((byte)(uVar22 >> 6) & 1) * auVar30._24_4_;
                  auVar31._28_4_ = (uint)(byte)(uVar22 >> 7) * auVar30._28_4_;
                  auVar30 = vpgatherqd_avx512f(*(undefined8 *)(uVar18 + 4));
                  bVar1 = (byte)uVar6;
                  auVar34 = vinserti64x4_avx512f
                                      (ZEXT3264(CONCAT428((uint)(byte)(uVar6 >> 7) * auVar30._28_4_,
                                                          CONCAT424((uint)((byte)(uVar6 >> 6) & 1) *
                                                                    auVar30._24_4_,
                                                                    CONCAT420((uint)((byte)(uVar6 >>
                                                                                           5) & 1) *
                                                                              auVar30._20_4_,
                                                                              CONCAT416((uint)((byte
                                                  )(uVar6 >> 4) & 1) * auVar30._16_4_,
                                                  CONCAT412((uint)((byte)(uVar6 >> 3) & 1) *
                                                            auVar30._12_4_,
                                                            CONCAT48((uint)((byte)(uVar6 >> 2) & 1)
                                                                     * auVar30._8_4_,
                                                                     CONCAT44((uint)((byte)(uVar6 >>
                                                                                           1) & 1) *
                                                                              auVar30._4_4_,
                                                                              (uint)(bVar1 & 1) *
                                                                              auVar30._0_4_)))))))),
                                       auVar31,1);
                  auVar30 = vpgatherqd_avx512f(CONCAT44(uRam000000000000000d,_DAT_00000009));
                  auVar32._4_4_ = (uint)((byte)(uVar22 >> 1) & 1) * auVar30._4_4_;
                  auVar32._0_4_ = (uint)(bVar17 & 1) * auVar30._0_4_;
                  auVar32._8_4_ = (uint)((byte)(uVar22 >> 2) & 1) * auVar30._8_4_;
                  auVar32._12_4_ = (uint)((byte)(uVar22 >> 3) & 1) * auVar30._12_4_;
                  auVar32._16_4_ = (uint)((byte)(uVar22 >> 4) & 1) * auVar30._16_4_;
                  auVar32._20_4_ = (uint)((byte)(uVar22 >> 5) & 1) * auVar30._20_4_;
                  auVar32._24_4_ = (uint)((byte)(uVar22 >> 6) & 1) * auVar30._24_4_;
                  auVar32._28_4_ = (uint)(byte)(uVar22 >> 7) * auVar30._28_4_;
                  auVar40 = vpmaxsd_avx512f(auVar34,auVar41);
                  auVar30 = vpgatherqd_avx512f(*(undefined8 *)(uVar18 + 8));
                  auVar34 = vinserti64x4_avx512f
                                      (ZEXT3264(CONCAT428((uint)(byte)(uVar6 >> 7) * auVar30._28_4_,
                                                          CONCAT424((uint)((byte)(uVar6 >> 6) & 1) *
                                                                    auVar30._24_4_,
                                                                    CONCAT420((uint)((byte)(uVar6 >>
                                                                                           5) & 1) *
                                                                              auVar30._20_4_,
                                                                              CONCAT416((uint)((byte
                                                  )(uVar6 >> 4) & 1) * auVar30._16_4_,
                                                  CONCAT412((uint)((byte)(uVar6 >> 3) & 1) *
                                                            auVar30._12_4_,
                                                            CONCAT48((uint)((byte)(uVar6 >> 2) & 1)
                                                                     * auVar30._8_4_,
                                                                     CONCAT44((uint)((byte)(uVar6 >>
                                                                                           1) & 1) *
                                                                              auVar30._4_4_,
                                                                              (uint)(bVar1 & 1) *
                                                                              auVar30._0_4_)))))))),
                                       auVar32,1);
                  auVar34 = vpmaxsd_avx512f(auVar34,auVar42);
                } while (uVar21 != 0);
                uVar29 = CONCAT11(bVar17,bVar1);
                auVar33 = vmovdqa32_avx512f(auVar34);
                auVar34._0_4_ =
                     (uint)(bVar1 & 1) * auVar33._0_4_ | (uint)!(bool)(bVar1 & 1) * auVar42._0_4_;
                bVar2 = (bool)((byte)(uVar29 >> 1) & 1);
                auVar34._4_4_ = (uint)bVar2 * auVar33._4_4_ | (uint)!bVar2 * auVar42._4_4_;
                bVar2 = (bool)((byte)(uVar29 >> 2) & 1);
                auVar34._8_4_ = (uint)bVar2 * auVar33._8_4_ | (uint)!bVar2 * auVar42._8_4_;
                bVar2 = (bool)((byte)(uVar29 >> 3) & 1);
                auVar34._12_4_ = (uint)bVar2 * auVar33._12_4_ | (uint)!bVar2 * auVar42._12_4_;
                bVar2 = (bool)((byte)(uVar29 >> 4) & 1);
                auVar34._16_4_ = (uint)bVar2 * auVar33._16_4_ | (uint)!bVar2 * auVar42._16_4_;
                bVar2 = (bool)((byte)(uVar29 >> 5) & 1);
                auVar34._20_4_ = (uint)bVar2 * auVar33._20_4_ | (uint)!bVar2 * auVar42._20_4_;
                bVar2 = (bool)((byte)(uVar29 >> 6) & 1);
                auVar34._24_4_ = (uint)bVar2 * auVar33._24_4_ | (uint)!bVar2 * auVar42._24_4_;
                bVar2 = (bool)((byte)(uVar29 >> 7) & 1);
                auVar34._28_4_ = (uint)bVar2 * auVar33._28_4_ | (uint)!bVar2 * auVar42._28_4_;
                auVar34._32_4_ =
                     (uint)(bVar17 & 1) * auVar33._32_4_ |
                     (uint)!(bool)(bVar17 & 1) * auVar42._32_4_;
                bVar2 = (bool)(bVar17 >> 1 & 1);
                auVar34._36_4_ = (uint)bVar2 * auVar33._36_4_ | (uint)!bVar2 * auVar42._36_4_;
                bVar2 = (bool)(bVar17 >> 2 & 1);
                auVar34._40_4_ = (uint)bVar2 * auVar33._40_4_ | (uint)!bVar2 * auVar42._40_4_;
                bVar2 = (bool)(bVar17 >> 3 & 1);
                auVar34._44_4_ = (uint)bVar2 * auVar33._44_4_ | (uint)!bVar2 * auVar42._44_4_;
                bVar2 = (bool)(bVar17 >> 4 & 1);
                auVar34._48_4_ = (uint)bVar2 * auVar33._48_4_ | (uint)!bVar2 * auVar42._48_4_;
                bVar2 = (bool)(bVar17 >> 5 & 1);
                auVar34._52_4_ = (uint)bVar2 * auVar33._52_4_ | (uint)!bVar2 * auVar42._52_4_;
                bVar2 = (bool)(bVar17 >> 6 & 1);
                auVar34._56_4_ = (uint)bVar2 * auVar33._56_4_ | (uint)!bVar2 * auVar42._56_4_;
                auVar34._60_4_ =
                     (uint)(bVar17 >> 7) * auVar33._60_4_ |
                     (uint)!(bool)(bVar17 >> 7) * auVar42._60_4_;
                auVar30 = vextracti64x4_avx512f(auVar34,1);
                auVar33 = vmovdqa32_avx512f(auVar40);
                auVar35._0_4_ =
                     (uint)(bVar1 & 1) * auVar33._0_4_ | (uint)!(bool)(bVar1 & 1) * auVar41._0_4_;
                bVar2 = (bool)((byte)(uVar29 >> 1) & 1);
                auVar35._4_4_ = (uint)bVar2 * auVar33._4_4_ | (uint)!bVar2 * auVar41._4_4_;
                bVar2 = (bool)((byte)(uVar29 >> 2) & 1);
                auVar35._8_4_ = (uint)bVar2 * auVar33._8_4_ | (uint)!bVar2 * auVar41._8_4_;
                bVar2 = (bool)((byte)(uVar29 >> 3) & 1);
                auVar35._12_4_ = (uint)bVar2 * auVar33._12_4_ | (uint)!bVar2 * auVar41._12_4_;
                bVar2 = (bool)((byte)(uVar29 >> 4) & 1);
                auVar35._16_4_ = (uint)bVar2 * auVar33._16_4_ | (uint)!bVar2 * auVar41._16_4_;
                bVar2 = (bool)((byte)(uVar29 >> 5) & 1);
                auVar35._20_4_ = (uint)bVar2 * auVar33._20_4_ | (uint)!bVar2 * auVar41._20_4_;
                bVar2 = (bool)((byte)(uVar29 >> 6) & 1);
                auVar35._24_4_ = (uint)bVar2 * auVar33._24_4_ | (uint)!bVar2 * auVar41._24_4_;
                bVar2 = (bool)((byte)(uVar29 >> 7) & 1);
                auVar35._28_4_ = (uint)bVar2 * auVar33._28_4_ | (uint)!bVar2 * auVar41._28_4_;
                auVar35._32_4_ =
                     (uint)(bVar17 & 1) * auVar33._32_4_ |
                     (uint)!(bool)(bVar17 & 1) * auVar41._32_4_;
                bVar2 = (bool)(bVar17 >> 1 & 1);
                auVar35._36_4_ = (uint)bVar2 * auVar33._36_4_ | (uint)!bVar2 * auVar41._36_4_;
                bVar2 = (bool)(bVar17 >> 2 & 1);
                auVar35._40_4_ = (uint)bVar2 * auVar33._40_4_ | (uint)!bVar2 * auVar41._40_4_;
                bVar2 = (bool)(bVar17 >> 3 & 1);
                auVar35._44_4_ = (uint)bVar2 * auVar33._44_4_ | (uint)!bVar2 * auVar41._44_4_;
                bVar2 = (bool)(bVar17 >> 4 & 1);
                auVar35._48_4_ = (uint)bVar2 * auVar33._48_4_ | (uint)!bVar2 * auVar41._48_4_;
                bVar2 = (bool)(bVar17 >> 5 & 1);
                auVar35._52_4_ = (uint)bVar2 * auVar33._52_4_ | (uint)!bVar2 * auVar41._52_4_;
                bVar2 = (bool)(bVar17 >> 6 & 1);
                auVar35._56_4_ = (uint)bVar2 * auVar33._56_4_ | (uint)!bVar2 * auVar41._56_4_;
                auVar35._60_4_ =
                     (uint)(bVar17 >> 7) * auVar33._60_4_ |
                     (uint)!(bool)(bVar17 >> 7) * auVar41._60_4_;
                auVar33 = vpmaxsd_avx512f(auVar34,ZEXT3264(auVar30));
                auVar3 = vpmaxsd_avx(auVar33._0_16_,auVar33._16_16_);
                auVar4 = vpshufd_avx(auVar3,0xee);
                auVar3 = vpmaxsd_avx(auVar3,auVar4);
                auVar4 = vpshufd_avx(auVar3,0x55);
                auVar3 = vpmaxsd_avx(auVar3,auVar4);
                uVar21 = (ulong)auVar3._0_4_;
                auVar30 = vextracti64x4_avx512f(auVar35,1);
                auVar33 = vpmaxsd_avx512f(auVar35,ZEXT3264(auVar30));
                auVar3 = vpmaxsd_avx(auVar33._0_16_,auVar33._16_16_);
                auVar4 = vpshufd_avx(auVar3,0xee);
                auVar3 = vpmaxsd_avx(auVar3,auVar4);
                auVar4 = vpshufd_avx(auVar3,0x55);
                auVar3 = vpmaxsd_avx(auVar3,auVar4);
                uVar22 = (ulong)auVar3._0_4_;
              }
              iVar10 = (int)uVar22;
              iVar7 = (int)uVar21;
              uVar23 = ((sVar9 - 1) + iVar10 * 8) / (uint)(iVar10 * 8);
              uVar11 = ((uVar8 - 1) + iVar7 * 8) / (uint)(iVar7 * 8);
              z->img_h_max = iVar10;
              z->img_v_max = iVar7;
              z->img_mcu_w = iVar10 * 8;
              z->img_mcu_h = iVar7 * 8;
              z->img_mcu_x = uVar23;
              z->img_mcu_y = uVar11;
              if (iVar12 < 1) {
                return 1;
              }
              lVar26 = 0;
              iVar12 = 1;
              while( true ) {
                iVar24 = *(int *)((long)&z->img_comp[0].h + lVar26);
                iVar20 = *(int *)((long)&z->img_comp[0].v + lVar26);
                *(int *)((long)&z->img_comp[0].x + lVar26) =
                     (int)((iVar24 * sVar9 + iVar10 + -1) / uVar22);
                iVar24 = iVar24 * uVar23;
                iVar27 = iVar20 * uVar11;
                a = iVar24 * 8;
                b = iVar27 * 8;
                *(int *)((long)&z->img_comp[0].y + lVar26) =
                     (int)((iVar20 * uVar8 + iVar7 + -1) / uVar21);
                *(int *)((long)&z->img_comp[0].w2 + lVar26) = a;
                *(int *)((long)&z->img_comp[0].h2 + lVar26) = b;
                pvVar16 = stbi__malloc_mad2(a,b,0xf);
                *(undefined8 *)((long)&z->img_comp[0].coeff + lVar26) = 0;
                *(undefined1 (*) [16])((long)&z->img_comp[0].raw_coeff + lVar26) =
                     (undefined1  [16])0x0;
                *(void **)((long)&z->img_comp[0].raw_data + lVar26) = pvVar16;
                iVar20 = extraout_EDX;
                if (pvVar16 == (void *)0x0) break;
                *(ulong *)((long)&z->img_comp[0].data + lVar26) =
                     (long)pvVar16 + 0xfU & 0xfffffffffffffff0;
                if (z->progressive != 0) {
                  *(int *)((long)&z->img_comp[0].coeff_w + lVar26) = iVar24;
                  *(int *)((long)&z->img_comp[0].coeff_h + lVar26) = iVar27;
                  pvVar16 = stbi__malloc_mad3(a,b,2,0xf);
                  *(void **)((long)&z->img_comp[0].raw_coeff + lVar26) = pvVar16;
                  iVar20 = extraout_EDX_00;
                  if (pvVar16 == (void *)0x0) break;
                  *(ulong *)((long)&z->img_comp[0].coeff + lVar26) =
                       (long)pvVar16 + 0xfU & 0xfffffffffffffff0;
                }
                lVar26 = lVar26 + 0x60;
                iVar12 = iVar12 + 1;
                if (uVar28 * 0x60 == lVar26) {
                  return 1;
                }
              }
              *(char **)(in_FS_OFFSET + -0x408) = "outofmem";
              stbi__free_jpeg_components(z,iVar12,iVar20);
              return 0;
            }
            goto LAB_003480c3;
          }
        }
        else if (s->read_from_callbacks != 0) {
          stbi__refill_buffer(s);
          pbVar19 = s->img_buffer;
          goto LAB_0034818b;
        }
        pcVar13 = "bad component count";
        goto LAB_00348737;
      }
    }
    else if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar14 = s->img_buffer;
      goto LAB_003480f8;
    }
    pcVar13 = "only 8-bit";
  }
LAB_00348737:
  *(char **)(in_FS_OFFSET + -0x408) = pcVar13;
  return 0;
}

Assistant:

static int stbi__process_frame_header(stbi__jpeg *z, int scan)
{
   stbi__context *s = z->s;
   int Lf,p,i,q, h_max=1,v_max=1,c;
   Lf = stbi__get16be(s);         if (Lf < 11) return stbi__err("bad SOF len","Corrupt JPEG"); // JPEG
   p  = stbi__get8(s);            if (p != 8) return stbi__err("only 8-bit","JPEG format not supported: 8-bit only"); // JPEG baseline
   s->img_y = stbi__get16be(s);   if (s->img_y == 0) return stbi__err("no header height", "JPEG format not supported: delayed height"); // Legal, but we don't handle it--but neither does IJG
   s->img_x = stbi__get16be(s);   if (s->img_x == 0) return stbi__err("0 width","Corrupt JPEG"); // JPEG requires
   if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
   c = stbi__get8(s);
   if (c != 3 && c != 1 && c != 4) return stbi__err("bad component count","Corrupt JPEG");
   s->img_n = c;
   for (i=0; i < c; ++i) {
      z->img_comp[i].data = NULL;
      z->img_comp[i].linebuf = NULL;
   }

   if (Lf != 8+3*s->img_n) return stbi__err("bad SOF len","Corrupt JPEG");

   z->rgb = 0;
   for (i=0; i < s->img_n; ++i) {
      static const unsigned char rgb[3] = { 'R', 'G', 'B' };
      z->img_comp[i].id = stbi__get8(s);
      if (s->img_n == 3 && z->img_comp[i].id == rgb[i])
         ++z->rgb;
      q = stbi__get8(s);
      z->img_comp[i].h = (q >> 4);  if (!z->img_comp[i].h || z->img_comp[i].h > 4) return stbi__err("bad H","Corrupt JPEG");
      z->img_comp[i].v = q & 15;    if (!z->img_comp[i].v || z->img_comp[i].v > 4) return stbi__err("bad V","Corrupt JPEG");
      z->img_comp[i].tq = stbi__get8(s);  if (z->img_comp[i].tq > 3) return stbi__err("bad TQ","Corrupt JPEG");
   }

   if (scan != STBI__SCAN_load) return 1;

   if (!stbi__mad3sizes_valid(s->img_x, s->img_y, s->img_n, 0)) return stbi__err("too large", "Image too large to decode");

   for (i=0; i < s->img_n; ++i) {
      if (z->img_comp[i].h > h_max) h_max = z->img_comp[i].h;
      if (z->img_comp[i].v > v_max) v_max = z->img_comp[i].v;
   }

   // compute interleaved mcu info
   z->img_h_max = h_max;
   z->img_v_max = v_max;
   z->img_mcu_w = h_max * 8;
   z->img_mcu_h = v_max * 8;
   // these sizes can't be more than 17 bits
   z->img_mcu_x = (s->img_x + z->img_mcu_w-1) / z->img_mcu_w;
   z->img_mcu_y = (s->img_y + z->img_mcu_h-1) / z->img_mcu_h;

   for (i=0; i < s->img_n; ++i) {
      // number of effective pixels (e.g. for non-interleaved MCU)
      z->img_comp[i].x = (s->img_x * z->img_comp[i].h + h_max-1) / h_max;
      z->img_comp[i].y = (s->img_y * z->img_comp[i].v + v_max-1) / v_max;
      // to simplify generation, we'll allocate enough memory to decode
      // the bogus oversized data from using interleaved MCUs and their
      // big blocks (e.g. a 16x16 iMCU on an image of width 33); we won't
      // discard the extra data until colorspace conversion
      //
      // img_mcu_x, img_mcu_y: <=17 bits; comp[i].h and .v are <=4 (checked earlier)
      // so these muls can't overflow with 32-bit ints (which we require)
      z->img_comp[i].w2 = z->img_mcu_x * z->img_comp[i].h * 8;
      z->img_comp[i].h2 = z->img_mcu_y * z->img_comp[i].v * 8;
      z->img_comp[i].coeff = 0;
      z->img_comp[i].raw_coeff = 0;
      z->img_comp[i].linebuf = NULL;
      z->img_comp[i].raw_data = stbi__malloc_mad2(z->img_comp[i].w2, z->img_comp[i].h2, 15);
      if (z->img_comp[i].raw_data == NULL)
         return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
      // align blocks for idct using mmx/sse
      z->img_comp[i].data = (stbi_uc*) (((size_t) z->img_comp[i].raw_data + 15) & ~15);
      if (z->progressive) {
         // w2, h2 are multiples of 8 (see above)
         z->img_comp[i].coeff_w = z->img_comp[i].w2 / 8;
         z->img_comp[i].coeff_h = z->img_comp[i].h2 / 8;
         z->img_comp[i].raw_coeff = stbi__malloc_mad3(z->img_comp[i].w2, z->img_comp[i].h2, sizeof(short), 15);
         if (z->img_comp[i].raw_coeff == NULL)
            return stbi__free_jpeg_components(z, i+1, stbi__err("outofmem", "Out of memory"));
         z->img_comp[i].coeff = (short*) (((size_t) z->img_comp[i].raw_coeff + 15) & ~15);
      }
   }

   return 1;
}